

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O1

void __thiscall
tcu::LogNumber<long>::LogNumber
          (LogNumber<long> *this,string *name,string *desc,string *unit,qpKeyValueTag tag,long value
          )

{
  pointer pcVar1;
  
  (this->m_name)._M_dataplus._M_p = (pointer)&(this->m_name).field_2;
  pcVar1 = (name->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>((string *)this,pcVar1,pcVar1 + name->_M_string_length);
  (this->m_desc)._M_dataplus._M_p = (pointer)&(this->m_desc).field_2;
  pcVar1 = (desc->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_desc,pcVar1,pcVar1 + desc->_M_string_length);
  (this->m_unit)._M_dataplus._M_p = (pointer)&(this->m_unit).field_2;
  pcVar1 = (unit->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_unit,pcVar1,pcVar1 + unit->_M_string_length);
  this->m_tag = tag;
  this->m_value = value;
  return;
}

Assistant:

LogNumber (const std::string& name, const std::string& desc, const std::string& unit, qpKeyValueTag tag, T value)
		: m_name	(name)
		, m_desc	(desc)
		, m_unit	(unit)
		, m_tag		(tag)
		, m_value	(value)
	{
	}